

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_test_utilization.c
# Opt level: O3

uint parse_unsigned(char *valname,char *prog)

{
  char *__nptr;
  int *piVar1;
  ulong uVar2;
  char *local_38;
  
  __nptr = _optarg;
  local_38 = (char *)0x0;
  piVar1 = __errno_location();
  *piVar1 = 0;
  uVar2 = strtoul(__nptr,&local_38,10);
  if ((((*piVar1 != 0x22 || uVar2 != 0xffffffffffffffff) && (*piVar1 == 0 || uVar2 != 0)) &&
      (local_38 != __nptr)) && (*local_38 == '\0')) {
    if (uVar2 >> 0x20 == 0) {
      return (uint)uVar2;
    }
    do {
      fprintf(_stderr,"ERROR: value %s is bigger than UINT_MAX (%u)",__nptr,0xffffffff);
LAB_00101b91:
      parse_unsigned_cold_1();
    } while( true );
  }
  fprintf(_stderr,"ERROR: strtoul() failed to convert the string %s",__nptr);
  goto LAB_00101b91;
}

Assistant:

static unsigned
parse_unsigned(const char *valname, const char *prog)
{
	unsigned val;
	if (str_to_unsigned(optarg, &val) != 0) {
		fprintf(stderr, "invalid %s value\n", valname);
		printf(usage_str, prog);
		exit(1);
	}
	return val;
}